

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O2

void __thiscall qclab::qgates::CX<std::complex<float>_>::CX(CX<std::complex<float>_> *this)

{
  (this->super_QControlledGate2<std::complex<float>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<float>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004cbb70;
  std::make_unique<qclab::qgates::PauliX<std::complex<float>>,int>((int *)&this->gate_);
  return;
}

Assistant:

CX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliX< T > >( 1 ) )
        { }